

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

bool __thiscall
features::Sift::descriptor_assignment(Sift *this,Keypoint *kp,Descriptor *desc,Octave *octave)

{
  Vector<float,_128> *__s;
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  pointer psVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar7;
  bool bVar8;
  bool bVar9;
  int i;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int dx;
  int iVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float __x;
  float fVar29;
  uint local_c0 [2];
  int bxi [2];
  int byi [2];
  float local_a8 [2];
  float weights [3] [2];
  int local_64 [2];
  int bti [2];
  undefined4 uStack_54;
  
  fVar23 = kp->sample;
  fVar1 = kp->x;
  fVar2 = kp->y;
  stack0xffffffffffffffa8 = (element_type *)CONCAT44(uStack_54,fVar23);
  if (fVar23 <= 0.0) {
    fVar23 = ceilf(fVar23 + -0.5);
  }
  else {
    fVar23 = floorf(fVar23 + 0.5);
  }
  fVar27 = (this->options).base_blur_sigma;
  fVar24 = exp2f(((float)bti[1] + 1.0) / (float)(this->options).num_samples_per_octave);
  lVar12 = (long)(int)fVar23 + 1;
  psVar5 = (octave->grad).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = psVar5[lVar12].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = psVar5[lVar12].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar14 = (int)(fVar1 + 0.5);
  iVar15 = (int)(fVar2 + 0.5);
  psVar5 = (octave->ori).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       psVar5[lVar12].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = psVar5[lVar12].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  iVar3 = *(int *)((long)&peVar6->super_TypedImageBase<float> + 8);
  iVar10 = *(int *)((long)&peVar6->super_TypedImageBase<float> + 0xc);
  __s = &desc->data;
  memset(__s,0,0x200);
  fVar23 = sinf(desc->orientation);
  bti[0] = (int)cosf(desc->orientation);
  fVar27 = fVar27 * fVar24 * 3.0;
  iVar18 = (int)(fVar27 * 1.4142135 * 5.0 * 0.5);
  bVar8 = iVar14 + iVar18 < iVar3;
  bVar9 = iVar18 + iVar15 < iVar10;
  if (bVar9 && ((iVar18 <= iVar15 && iVar18 <= iVar14) && bVar8)) {
    if (-1 < iVar18) {
      lVar12 = *(long *)&((ImageData *)((long)&peVar6->super_TypedImageBase<float> + 0x18))->
                         super__Vector_base<float,_std::allocator<float>_>;
      lVar7 = *(long *)&((ImageData *)
                        ((long)&stack0xffffffffffffffa8->super_TypedImageBase<float> + 0x18))->
                        super__Vector_base<float,_std::allocator<float>_>;
      iVar10 = -iVar18;
      do {
        fVar24 = (float)iVar10 + ((float)iVar15 - fVar2);
        weights[2][1] = fVar24 * (float)bti[0];
        iVar20 = -iVar18;
        do {
          lVar13 = (long)((iVar10 + iVar15) * iVar3 + iVar14 + iVar20);
          fVar25 = *(float *)(lVar7 + lVar13 * 4) - desc->orientation;
          fVar28 = (float)iVar20 + ((float)iVar14 - fVar1);
          fVar29 = ((float)bti[0] * fVar28 + fVar23 * fVar24) / fVar27 + 1.5;
          __x = (fVar28 * -fVar23 + weights[2][1]) / fVar27 + 1.5;
          stack0xffffffffffffffa8 =
               (element_type *)CONCAT44(uStack_54,*(undefined4 *)(lVar12 + lVar13 * 4));
          fVar25 = ((float)(-(uint)(fVar25 < 0.0) & (uint)(fVar25 + 6.2831855) |
                           ~-(uint)(fVar25 < 0.0) & (uint)fVar25) * 8.0) / 6.2831855 + -0.5;
          fVar28 = expf(((fVar29 + -1.5) * (fVar29 + -1.5) + (__x + -1.5) * (__x + -1.5)) * -0.125);
          fVar26 = floorf(fVar29);
          local_c0[0] = (uint)fVar26;
          iVar17 = local_c0[0] + 1;
          local_c0[1] = iVar17;
          fVar26 = floorf(__x);
          bxi[0] = (int)fVar26;
          iVar21 = bxi[0] + 1;
          bxi[1] = iVar21;
          fVar26 = floorf(fVar25);
          iVar11 = (int)fVar26;
          local_64[0] = iVar11;
          local_64[1] = iVar11 + 1;
          fVar26 = (float)iVar17;
          local_a8[0] = fVar26 - fVar29;
          local_a8[1] = (fVar29 - fVar26) + 1.0;
          fVar26 = (float)iVar21;
          weights[0][0] = fVar26 - __x;
          fVar29 = (float)(iVar11 + 1);
          weights[0][1] = (__x - fVar26) + 1.0;
          weights[1][0] = fVar29 - fVar25;
          weights[1][1] = (fVar25 - fVar29) + 1.0;
          if (iVar11 < 0) {
            local_64[0] = iVar11 + 8;
          }
          if (6 < iVar11) {
            local_64[1] = iVar11 + -7;
          }
          lVar13 = 0;
          do {
            lVar16 = 0;
            do {
              uVar4 = local_c0[lVar16];
              lVar19 = 0;
              do {
                if ((uVar4 < 4) && ((uint)bxi[lVar13] < 4)) {
                  iVar11 = (bxi[lVar13] << 5 | uVar4 * 8) + local_64[lVar19];
                  __s->v[iVar11] =
                       local_a8[lVar16] * (float)bti[1] * fVar28 * weights[0][lVar13] *
                       weights[1][lVar19] + __s->v[iVar11];
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              bVar22 = lVar16 == 0;
              lVar16 = lVar16 + 1;
            } while (bVar22);
            bVar22 = lVar13 == 0;
            lVar13 = lVar13 + 1;
          } while (bVar22);
          iVar20 = iVar20 + 1;
        } while (iVar18 + 1 != iVar20);
        bVar22 = iVar10 != iVar18;
        iVar10 = iVar10 + 1;
      } while (bVar22);
    }
    fVar23 = 0.0;
    lVar12 = 0;
    do {
      fVar1 = *(float *)((long)__s->v + lVar12);
      fVar23 = fVar23 + fVar1 * fVar1;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x200);
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
    }
    else {
      fVar23 = SQRT(fVar23);
    }
    lVar12 = 0;
    do {
      *(float *)((long)__s->v + lVar12) = *(float *)((long)__s->v + lVar12) / fVar23;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x200);
    lVar12 = 0;
    do {
      fVar23 = 0.2;
      if (__s->v[lVar12] <= 0.2) {
        fVar23 = __s->v[lVar12];
      }
      __s->v[lVar12] = fVar23;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x80);
    fVar23 = 0.0;
    lVar12 = 0;
    do {
      fVar1 = *(float *)((long)__s->v + lVar12);
      fVar23 = fVar23 + fVar1 * fVar1;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x200);
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
    }
    else {
      fVar23 = SQRT(fVar23);
    }
    lVar12 = 0;
    do {
      *(float *)((long)__s->v + lVar12) = *(float *)((long)__s->v + lVar12) / fVar23;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x200);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar9 && ((iVar18 <= iVar15 && iVar18 <= iVar14) && bVar8);
}

Assistant:

bool
Sift::descriptor_assignment (Keypoint const& kp, Descriptor& desc,
    Octave const* octave)
{
    /*
     * The final feature vector has size PXB * PXB * OHB.
     * The following constants should not be changed yet, as the
     * (PXB^2 * OHB = 128) element feature vector is still hard-coded.
     */
    //int const PIX = 16; // Descriptor region with 16x16 pixel
    int const PXB = 4; // Pixel bins with 4x4 bins
    int const OHB = 8; // Orientation histogram with 8 bins

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /* Clear feature vector. */
    desc.data.fill(0.0f);

    /* Rotation constants given by descriptor orientation. */
    float const sino = std::sin(desc.orientation);
    float const coso = std::cos(desc.orientation);

    /*
     * Compute window size.
     * Each spacial bin has an extension of 3 * sigma (sigma is the scale
     * of the keypoint). For interpolation we need another half bin at
     * both ends in each dimension. And since the window can be arbitrarily
     * rotated, we need to multiply with sqrt(2). The window size is:
     * 2W = sqrt(2) * 3 * sigma * (PXB + 1).
     */
    float const binsize = 3.0f * sigma;
    int win = MATH_SQRT2 * binsize * (float)(PXB + 1) * 0.5f;
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return false;

    /*
     * Iterate over the window, intersected with the image region
     * from (1,1) to (w-2, h-2) since gradients/orientations are
     * not defined at the boundary pixels. Add all samples to the
     * corresponding bin.
     */
    int const center = iy * width + ix; // Center pixel at KP location
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Get pixel gradient magnitude and orientation. */
            float const mod = grad->at(center + yoff + dx);
            float const angle = ori->at(center + yoff + dx);
            float theta = angle - desc.orientation;
            if (theta < 0.0f)
                theta += 2.0f * MATH_PI;

            /* Compute fractional coordinates w.r.t. the window. */
            float const winx = (float)dx - dxf;
            float const winy = (float)dy - dyf;

            /*
             * Compute normalized coordinates w.r.t. bins. The window
             * coordinates are rotated around the keypoint. The bins are
             * chosen such that 0 is the coordinate of the first bins center
             * in each dimension. In other words, (0,0,0) is the coordinate
             * of the first bin center in the three dimensional histogram.
             */
            float binoff = (float)(PXB - 1) / 2.0f;
            float binx = (coso * winx + sino * winy) / binsize + binoff;
            float biny = (-sino * winx + coso * winy) / binsize + binoff;
            float bint = theta * (float)OHB / (2.0f * MATH_PI) - 0.5f;

            /* Compute circular window weight for the sample. */
            float gaussian_sigma = 0.5f * (float)PXB;
            float gaussian_weight = math::gaussian_xx
                (MATH_POW2(binx - binoff) + MATH_POW2(biny - binoff),
                gaussian_sigma);

            /* Total contribution of the sample in the histogram is now: */
            float contrib = mod * gaussian_weight;

            /*
             * Distribute values into bins (using trilinear interpolation).
             * Each sample is inserted into 8 bins. Some of these bins may
             * not exist, because the sample is outside the keypoint window.
             */
            int bxi[2] = { (int)std::floor(binx), (int)std::floor(binx) + 1 };
            int byi[2] = { (int)std::floor(biny), (int)std::floor(biny) + 1 };
            int bti[2] = { (int)std::floor(bint), (int)std::floor(bint) + 1 };

            float weights[3][2] = {
                { (float)bxi[1] - binx, 1.0f - ((float)bxi[1] - binx) },
                { (float)byi[1] - biny, 1.0f - ((float)byi[1] - biny) },
                { (float)bti[1] - bint, 1.0f - ((float)bti[1] - bint) }
            };

            // Wrap around orientation histogram
            if (bti[0] < 0)
                bti[0] += OHB;
            if (bti[1] >= OHB)
                bti[1] -= OHB;

            /* Iterate the 8 bins and add weighted contrib to each. */
            int const xstride = OHB;
            int const ystride = OHB * PXB;
            for (int y = 0; y < 2; ++y)
                for (int x = 0; x < 2; ++x)
                    for (int t = 0; t < 2; ++t)
                    {
                        if (bxi[x] < 0 || bxi[x] >= PXB
                            || byi[y] < 0 || byi[y] >= PXB)
                            continue;

                        int idx = bti[t] + bxi[x] * xstride + byi[y] * ystride;
                        desc.data[idx] += contrib * weights[0][x]
                            * weights[1][y] * weights[2][t];
                    }
        }
    }

    /* Normalize the feature vector. */
    desc.data.normalize();

    /* Truncate descriptor values to 0.2. */
    for (int i = 0; i < PXB * PXB * OHB; ++i)
        desc.data[i] = std::min(desc.data[i], 0.2f);

    /* Normalize once again. */
    desc.data.normalize();

    return true;
}